

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

array_storage * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
get_allocator<std::allocator<char>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  byte_string_storage *in_RSI;
  array_storage *in_RDI;
  array_storage *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::storage_kind
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RSI);
  switch(jVar1) {
  case json_reference:
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::json_reference_storage::value
              ((json_reference_storage *)0x355d22);
    get_allocator<std::allocator<char>>(in_stack_ffffffffffffffe8);
    break;
  default:
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::get_default_allocator
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,in_RSI);
    break;
  case byte_str:
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::byte_string_storage::
    get_allocator(in_RSI);
    break;
  case object:
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::object_storage::get_allocator
              ((object_storage *)this);
    break;
  case array:
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_storage::get_allocator
              (in_RDI);
    break;
  case long_str:
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::long_string_storage::
    get_allocator((long_string_storage *)in_RSI);
  }
  return this_00;
}

Assistant:

allocator_type get_allocator() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::long_str:
                    return cast<long_string_storage>().get_allocator();
                case json_storage_kind::byte_str:
                    return cast<byte_string_storage>().get_allocator();
                case json_storage_kind::array:
                    return cast<array_storage>().get_allocator();
                case json_storage_kind::object:
                    return cast<object_storage>().get_allocator();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().get_allocator();
                default:
                    return get_default_allocator(typename std::allocator_traits<U>::is_always_equal());
            }
        }